

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
::Remove(BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
         *this,PropertyRecord **key)

{
  int iVar1;
  Type piVar2;
  Type pSVar3;
  uint uVar4;
  ulong in_RAX;
  uint depth;
  uint unaff_R13D;
  uint uVar5;
  bool bVar6;
  ulong uStack_38;
  
  piVar2 = this->buckets;
  depth = 0;
  if (piVar2 == (Type)0x0) {
    uVar5 = 0;
    uStack_38 = in_RAX;
  }
  else {
    uVar4 = GetBucket((*key)->hash * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uStack_38 = (ulong)uVar4 << 0x20;
    unaff_R13D = piVar2[uVar4];
    if (-1 < (long)(int)unaff_R13D) {
      pSVar3 = this->entries;
      if (pSVar3[(int)unaff_R13D].
          super_DefaultHashedEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
          .super_ImplicitKeyValueEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*>.
          super_ValueEntry<const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ValueEntryData<const_Js::PropertyRecord_*>_>
          .super_ValueEntryData<const_Js::PropertyRecord_*>.value == *key) {
        depth = 0;
        uVar5 = 0xffffffff;
      }
      else {
        depth = 0;
        do {
          uVar5 = unaff_R13D;
          depth = depth + 1;
          unaff_R13D = pSVar3[uVar5].
                       super_DefaultHashedEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                       .
                       super_ImplicitKeyValueEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*>
                       .
                       super_ValueEntry<const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ValueEntryData<const_Js::PropertyRecord_*>_>
                       .super_ValueEntryData<const_Js::PropertyRecord_*>.next;
          if ((long)(int)unaff_R13D < 0) goto LAB_007cc39c;
        } while (pSVar3[(int)unaff_R13D].
                 super_DefaultHashedEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                 .
                 super_ImplicitKeyValueEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*>
                 .
                 super_ValueEntry<const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ValueEntryData<const_Js::PropertyRecord_*>_>
                 .super_ValueEntryData<const_Js::PropertyRecord_*>.value != *key);
      }
      bVar6 = true;
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,depth);
      }
      goto LAB_007cc3b0;
    }
    uVar5 = 0xffffffff;
  }
LAB_007cc39c:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  bVar6 = false;
LAB_007cc3b0:
  if (bVar6 != false) {
    iVar1 = this->entries[(int)unaff_R13D].
            super_DefaultHashedEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
            .super_ImplicitKeyValueEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*>.
            super_ValueEntry<const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ValueEntryData<const_Js::PropertyRecord_*>_>
            .super_ValueEntryData<const_Js::PropertyRecord_*>.next;
    if ((int)uVar5 < 0) {
      this->buckets[uStack_38 >> 0x20] = iVar1;
    }
    else {
      this->entries[uVar5].
      super_DefaultHashedEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
      .super_ImplicitKeyValueEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*>.
      super_ValueEntry<const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ValueEntryData<const_Js::PropertyRecord_*>_>
      .super_ValueEntryData<const_Js::PropertyRecord_*>.next = iVar1;
    }
    this->entries[(int)unaff_R13D].
    super_DefaultHashedEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
    .super_ImplicitKeyValueEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*>.
    super_ValueEntry<const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ValueEntryData<const_Js::PropertyRecord_*>_>
    .super_ValueEntryData<const_Js::PropertyRecord_*>.value = (PropertyRecord *)0x0;
    SetNextFreeEntryIndex
              (this,this->entries + (int)unaff_R13D,-(uint)(this->freeCount == 0) | this->freeList);
    this->freeList = unaff_R13D;
    this->freeCount = this->freeCount + 1;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Remove(this->stats,this->buckets[uStack_38 >> 0x20] == -1);
    }
  }
  return bVar6;
}

Assistant:

bool Remove(const TKey& key)
        {
            int i, last;
            uint targetBucket;
            if(FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }